

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall
BufferedFile::BufferedFile(BufferedFile *this,AutoFile *file,uint64_t nBufSize,uint64_t nRewindIn)

{
  long lVar1;
  unsigned_long uVar2;
  error_code *this_00;
  ulong in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  allocator<std::byte> *in_stack_ffffffffffffff68;
  io_errc in_stack_ffffffffffffff74;
  allocator_type *in_stack_ffffffffffffff80;
  error_code *peVar3;
  value_type *in_stack_ffffffffffffff88;
  vector<std::byte,_std::allocator<std::byte>_> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  uVar2 = std::numeric_limits<unsigned_long>::max();
  in_RDI[3] = uVar2;
  in_RDI[4] = in_RCX;
  this_01 = (vector<std::byte,_std::allocator<std::byte>_> *)(in_RDI + 5);
  std::allocator<std::byte>::allocator(in_stack_ffffffffffffff68);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (this_01,(size_type)in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<std::byte>::~allocator(in_stack_ffffffffffffff68);
  if (in_RCX < in_RDX) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this_00 = (error_code *)__cxa_allocate_exception(0x20);
    peVar3 = this_00;
    std::error_code::error_code<std::io_errc,void>(this_00,in_stack_ffffffffffffff74);
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)peVar3,(error_code *)"Rewind limit must be less than buffer size");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

BufferedFile(AutoFile& file, uint64_t nBufSize, uint64_t nRewindIn)
        : m_src{file}, nReadLimit{std::numeric_limits<uint64_t>::max()}, nRewind{nRewindIn}, vchBuf(nBufSize, std::byte{0})
    {
        if (nRewindIn >= nBufSize)
            throw std::ios_base::failure("Rewind limit must be less than buffer size");
    }